

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
* __thiscall
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
           *__return_storage_ptr__,QPDFEmbeddedFileDocumentHelper *this)

{
  _Rb_tree_header *p_Var1;
  QPDFNameTreeObjectHelper *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  QPDFFileSpecObjectHelper *pQVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  reference __k;
  mapped_type *pmVar5;
  iterator __end2;
  iterator __begin2;
  undefined1 local_d9;
  QPDFFileSpecObjectHelper *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  iterator local_c0;
  iterator local_78;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (((this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->embedded_files).
            super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (QPDFNameTreeObjectHelper *)0x0) {
    QPDFNameTreeObjectHelper::begin(&local_78,this_00);
    QPDFNameTreeObjectHelper::end(&local_c0,this_00);
    while( true ) {
      bVar4 = QPDFNameTreeObjectHelper::iterator::operator==(&local_78,&local_c0);
      if (bVar4) break;
      __k = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_(&local_78);
      local_d8 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFFileSpecObjectHelper,std::allocator<QPDFFileSpecObjectHelper>,QPDFObjectHandle_const&>
                (a_Stack_d0,&local_d8,(allocator<QPDFFileSpecObjectHelper> *)&local_d9,&__k->second)
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
               ::operator[](__return_storage_ptr__,&__k->first);
      _Var3._M_pi = a_Stack_d0[0]._M_pi;
      pQVar2 = local_d8;
      local_d8 = (QPDFFileSpecObjectHelper *)0x0;
      a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (pmVar5->super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (pmVar5->super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           pQVar2;
      (pmVar5->super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
      ._M_pi = _Var3._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
      }
      QPDFNameTreeObjectHelper::iterator::operator++(&local_78);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>>
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles()
{
    std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>> result;
    if (m->embedded_files) {
        for (auto const& i: *(m->embedded_files)) {
            result[i.first] = std::make_shared<QPDFFileSpecObjectHelper>(i.second);
        }
    }
    return result;
}